

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hash_table.cpp
# Opt level: O1

uint __thiscall ON_Hash32Table::RemoveAllItems(ON_Hash32Table *this,ON_FixedSizePool *fsp)

{
  uint uVar1;
  ON_Hash32TableItem *pOVar2;
  size_t __n;
  size_t sVar3;
  uint uVar4;
  uint removed_item_count;
  ON_Hash32TableItem *__s;
  ulong uVar5;
  
  __n = ON_FixedSizePool::SizeofElement(fsp);
  sVar3 = ON_FixedSizePool::ActiveElementCount(fsp);
  if (0xf < __n) {
    uVar1 = this->m_item_count;
    if (uVar1 <= sVar3) {
      uVar4 = 0;
      if (uVar1 != 0) {
        if (sVar3 == uVar1) {
          if (this->m_hash_table_capacity != 0) {
            uVar5 = 0;
            uVar4 = 0;
            do {
              __s = this->m_hash_table[uVar5];
              if (__s != (ON_Hash32TableItem *)0x0) {
                this->m_hash_table[uVar5] = (ON_Hash32TableItem *)0x0;
                do {
                  pOVar2 = __s->m_internal_next;
                  memset(__s,0,__n);
                  ON_FixedSizePool::ReturnElement(fsp,__s);
                  uVar4 = uVar4 + 1;
                  __s = pOVar2;
                } while (pOVar2 != (ON_Hash32TableItem *)0x0);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 < this->m_hash_table_capacity);
          }
        }
        else {
          this->m_item_count = 0;
          memset(this->m_hash_table,0,(ulong)this->m_hash_table_capacity << 3);
          ON_FixedSizePool::ReturnAll(fsp);
          uVar4 = uVar1;
        }
      }
      if (uVar4 != this->m_item_count) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hash_table.cpp"
                   ,0x12f,"","Corrupt hash table.");
      }
      this->m_item_count = 0;
      return uVar4;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hash_table.cpp"
             ,0x10c,"","Invalid fsp parameter.");
  uVar1 = this->m_item_count;
  this->m_item_count = 0;
  memset(this->m_hash_table,0,(ulong)this->m_hash_table_capacity << 3);
  return uVar1;
}

Assistant:

unsigned int ON_Hash32Table::RemoveAllItems(
  class ON_FixedSizePool& fsp
)
{
  const size_t sizeof_item = fsp.SizeofElement();
  const size_t fsp_item_count = fsp.ActiveElementCount();
  if (sizeof_item < sizeof(ON_Hash32TableItem) || fsp_item_count < (size_t)m_item_count)
  {
    ON_ERROR("Invalid fsp parameter.");
    return RemoveAllItems();
  }

  unsigned int removed_item_count = 0;
  if (m_item_count > 0)
  {
    const bool bReturnItem = (fsp_item_count == (size_t)m_item_count);
    if (false == bReturnItem)
    {
      removed_item_count = RemoveAllItems();
      fsp.ReturnAll();
    }
    else
    {
      for (ON__UINT32 i = 0; i < m_hash_table_capacity; i++)
      {
        ON_Hash32TableItem* p = m_hash_table[i];
        if (nullptr == p)
          continue;
        m_hash_table[i] = nullptr;
        while (nullptr != p)
        {
          ON_Hash32TableItem* next = p->m_internal_next;
          memset(p, 0, sizeof_item);
          fsp.ReturnElement(p);
          p = next;
          removed_item_count++;
        }
      }
    }
  }

  if (removed_item_count != m_item_count)
  {
    ON_ERROR("Corrupt hash table.");
  }
  m_item_count = 0;
  return removed_item_count;
}